

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O0

void tommy_tree_foreach_node(tommy_tree_node *root,tommy_foreach_func *func)

{
  long lVar1;
  tommy_tree_node *root_00;
  long in_FS_OFFSET;
  tommy_tree_node *next;
  tommy_foreach_func *func_local;
  tommy_tree_node *root_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (root != (tommy_tree_node *)0x0) {
    tommy_tree_foreach_node(root->prev,func);
    root_00 = root->next;
    (*func)(root->data);
    tommy_tree_foreach_node(root_00,func);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void tommy_tree_foreach_node(tommy_tree_node* root, tommy_foreach_func* func)
{
	tommy_tree_node* next;

	if (!root)
		return;

	tommy_tree_foreach_node(root->prev, func);

	/* make a copy in case func is free() */
	next = root->next;

	func(root->data);

	tommy_tree_foreach_node(next, func);
}